

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void SerializeMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr,Wrapper<CustomUintFormatter<2,true>,unsigned_short_const&>>
               (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                *s,CNetAddr *args,
               Wrapper<CustomUintFormatter<2,_true>,_const_unsigned_short_&> *args_1)

{
  DataStream *pDVar1;
  long in_FS_OFFSET;
  uint64_t raw;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::
  Serialize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
            (args,s);
  local_20 = ((ulong)*args_1->m_object & 0xff00) << 0x28 | (ulong)*args_1->m_object << 0x38;
  pDVar1 = s->m_substream->m_substream;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)pDVar1,
             (pDVar1->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish,(long)&local_20 + 6,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}